

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atom.cpp
# Opt level: O2

void __thiscall Bracket::display(Bracket *this,int indent)

{
  ostream *poVar1;
  _List_node_base *p_Var2;
  
  printSpace(indent);
  poVar1 = std::operator<<((ostream *)&std::cout,"(");
  poVar1 = std::operator<<(poVar1,(string *)&this->func);
  std::endl<char,std::char_traits<char>>(poVar1);
  p_Var2 = (_List_node_base *)&this->para;
  while (p_Var2 = (((_List_base<Atom_*,_std::allocator<Atom_*>_> *)&p_Var2->_M_next)->_M_impl).
                  _M_node.super__List_node_base._M_next, p_Var2 != (_List_node_base *)&this->para) {
    (**(code **)(*(long *)p_Var2[1]._M_next + 0x10))(p_Var2[1]._M_next,indent + 1);
  }
  printSpace(indent);
  poVar1 = std::operator<<((ostream *)&std::cout,")");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Bracket::display(int indent) {
    printSpace(indent);
    std::cout << "(" << func << std::endl;
    for (auto &i: para) {
        i->display(indent + 1);
    }
    printSpace(indent);
    std::cout << ")" << std::endl;
}